

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_scan_avx2_256_8.c
# Opt level: O0

parasail_result_t *
parasail_nw_rowcol_scan_profile_avx2_256_8
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  __m256i alVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  char cVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [24];
  undefined1 auVar18 [24];
  __m256i alVar19;
  byte bVar20;
  byte bVar21;
  byte bVar22;
  byte bVar23;
  __m256i *palVar24;
  uint in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  undefined1 auVar25 [64];
  __m256i vH_2;
  __m256i vH_1;
  __m256i vFt;
  __m256i vW;
  __m256i *pvW;
  __m256i vHp;
  __m256i vH;
  __m256i vF;
  __m256i vHt;
  __m256i vE;
  __m256i vGapper;
  int64_t tmp_1;
  int64_t tmp;
  __m256i_8_t e;
  __m256i_8_t h;
  int32_t segNum;
  int32_t index;
  parasail_result_t *result;
  __m256i vSegLenXgap;
  __m256i vNegInfFront;
  __m256i vSaturationCheckMax;
  __m256i vSaturationCheckMin;
  __m256i vPosLimit;
  __m256i vNegLimit;
  int8_t score;
  __m256i vZero;
  int8_t POS_LIMIT;
  int8_t NEG_LIMIT;
  __m256i vGapE;
  __m256i vGapO;
  __m256i *pvGapper;
  __m256i *pvH;
  __m256i *pvHt;
  int8_t *boundary;
  __m256i *pvE;
  __m256i *pvP;
  int32_t position;
  int32_t offset;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int32_t end_ref;
  int32_t end_query;
  int32_t s1Len;
  int32_t k;
  int32_t j;
  int32_t i;
  int32_t in_stack_fffffffffffff170;
  int32_t in_stack_fffffffffffff174;
  long in_stack_fffffffffffff178;
  long in_stack_fffffffffffff180;
  long in_stack_fffffffffffff188;
  undefined3 in_stack_fffffffffffff190;
  undefined4 uVar26;
  int *in_stack_fffffffffffff1a0;
  __m256i local_e60;
  char cStack_e41;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  __m256i local_dc0;
  undefined1 local_da0 [24];
  longlong lStack_d88;
  undefined1 local_d80 [32];
  undefined1 local_d60 [32];
  longlong local_d40;
  longlong lStack_d38;
  longlong lStack_d30;
  longlong lStack_d28;
  undefined1 local_d20 [32];
  longlong local_ce0;
  longlong lStack_cd8;
  longlong lStack_cd0;
  longlong lStack_cc8;
  longlong local_cc0;
  longlong lStack_cb8;
  longlong lStack_cb0;
  longlong lStack_ca8;
  int local_c90;
  int local_c8c;
  parasail_result_t *local_c88;
  undefined1 local_c80 [32];
  undefined1 local_c60 [32];
  undefined1 local_c40 [32];
  undefined1 local_c20 [32];
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  byte local_ba1;
  undefined8 local_ba0;
  ulong uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  byte local_b62;
  byte local_b61;
  undefined1 local_b60 [16];
  undefined1 auStack_b50 [16];
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  __m256i *local_b10;
  __m256i *local_b08;
  __m256i *local_b00;
  int8_t *local_af8;
  __m256i *local_af0;
  long local_ae8;
  int local_ae0;
  int local_adc;
  int local_ad8;
  int local_ad4;
  long local_ad0;
  int local_ac4;
  int local_ac0;
  int local_abc;
  int local_ab8;
  int local_ab4;
  int local_ab0;
  uint local_aac;
  uint local_aa8;
  int local_aa4;
  long local_aa0;
  parasail_result_t *local_a90;
  byte local_a87;
  byte local_a86;
  byte local_a85;
  byte local_a84;
  byte local_a83;
  byte local_a82;
  byte local_a81;
  undefined1 local_a80 [32];
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  longlong local_9e0;
  longlong lStack_9d8;
  longlong lStack_9d0;
  longlong lStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  longlong local_9a0;
  longlong lStack_998;
  longlong lStack_990;
  longlong lStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  longlong local_940;
  longlong lStack_938;
  longlong lStack_930;
  longlong lStack_928;
  undefined1 local_920 [32];
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  longlong local_8e0;
  longlong lStack_8d8;
  longlong lStack_8d0;
  longlong lStack_8c8;
  __m256i *local_8a8;
  longlong local_8a0;
  longlong lStack_898;
  longlong lStack_890;
  longlong lStack_888;
  __m256i *local_868;
  longlong local_860;
  longlong lStack_858;
  longlong lStack_850;
  longlong lStack_848;
  __m256i *local_828;
  longlong local_820;
  longlong lStack_818;
  longlong lStack_810;
  longlong lStack_808;
  __m256i *local_7e8;
  __m256i *local_7a8;
  __m256i *local_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined1 local_720 [16];
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  longlong lStack_6a8;
  undefined1 local_6a0 [16];
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  longlong lStack_668;
  longlong local_660;
  longlong lStack_658;
  longlong lStack_650;
  longlong lStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined1 local_620 [16];
  undefined8 uStack_610;
  undefined8 uStack_608;
  longlong local_600;
  longlong lStack_5f8;
  longlong lStack_5f0;
  longlong lStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  ulong uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  __m256i *local_5a0;
  __m256i *local_598;
  __m256i *local_590;
  __m256i *local_588;
  undefined1 (*local_580) [32];
  __m256i *local_578;
  __m256i *local_570;
  __m256i *local_568;
  longlong local_560;
  longlong lStack_558;
  longlong lStack_550;
  longlong lStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  longlong lStack_4e8;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined1 local_420 [32];
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  longlong local_3e0;
  longlong lStack_3d8;
  longlong lStack_3d0;
  longlong lStack_3c8;
  longlong local_3c0;
  longlong lStack_3b8;
  longlong lStack_3b0;
  longlong lStack_3a8;
  undefined1 local_3a0 [32];
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  longlong local_320;
  longlong lStack_318;
  longlong lStack_310;
  longlong lStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined1 local_200 [16];
  undefined1 auStack_1f0 [16];
  byte local_1e0;
  byte local_1df;
  byte local_1de;
  byte local_1dd;
  byte local_1dc;
  byte local_1db;
  byte local_1da;
  byte local_1d9;
  byte local_1d8;
  byte local_1d7;
  byte local_1d6;
  byte local_1d5;
  byte local_1d4;
  byte local_1d3;
  byte local_1d2;
  byte local_1d1;
  byte local_1d0;
  byte local_1cf;
  byte local_1ce;
  byte local_1cd;
  byte local_1cc;
  byte local_1cb;
  byte local_1ca;
  byte local_1c9;
  byte local_1c8;
  byte local_1c7;
  byte local_1c6;
  byte local_1c5;
  byte local_1c4;
  byte local_1c3;
  byte local_1c2;
  byte local_1c1;
  undefined1 local_1c0 [32];
  byte local_1a0;
  byte local_19f;
  byte local_19e;
  byte local_19d;
  byte local_19c;
  byte local_19b;
  byte local_19a;
  byte local_199;
  byte local_198;
  byte local_197;
  byte local_196;
  byte local_195;
  byte local_194;
  byte local_193;
  byte local_192;
  byte local_191;
  byte local_190;
  byte local_18f;
  byte local_18e;
  byte local_18d;
  byte local_18c;
  byte local_18b;
  byte local_18a;
  byte local_189;
  byte local_188;
  byte local_187;
  byte local_186;
  byte local_185;
  byte local_184;
  byte local_183;
  byte local_182;
  byte local_181;
  undefined1 local_180 [16];
  undefined1 auStack_170 [16];
  byte local_160;
  byte local_15f;
  byte local_15e;
  byte local_15d;
  byte local_15c;
  byte local_15b;
  byte local_15a;
  byte local_159;
  byte local_158;
  byte local_157;
  byte local_156;
  byte local_155;
  byte local_154;
  byte local_153;
  byte local_152;
  byte local_151;
  byte local_150;
  byte local_14f;
  byte local_14e;
  byte local_14d;
  byte local_14c;
  byte local_14b;
  byte local_14a;
  byte local_149;
  byte local_148;
  byte local_147;
  byte local_146;
  byte local_145;
  byte local_144;
  byte local_143;
  byte local_142;
  byte local_141;
  undefined1 local_140 [16];
  undefined1 auStack_130 [16];
  byte local_120;
  byte local_11f;
  byte local_11e;
  byte local_11d;
  byte local_11c;
  byte local_11b;
  byte local_11a;
  byte local_119;
  byte local_118;
  byte local_117;
  byte local_116;
  byte local_115;
  byte local_114;
  byte local_113;
  byte local_112;
  byte local_111;
  byte local_110;
  byte local_10f;
  byte local_10e;
  byte local_10d;
  byte local_10c;
  byte local_10b;
  byte local_10a;
  byte local_109;
  byte local_108;
  byte local_107;
  byte local_106;
  byte local_105;
  byte local_104;
  byte local_103;
  byte local_102;
  byte local_101;
  undefined1 local_100 [16];
  undefined1 auStack_f0 [16];
  byte local_e0;
  byte local_df;
  byte local_de;
  byte local_dd;
  byte local_dc;
  byte local_db;
  byte local_da;
  byte local_d9;
  byte local_d8;
  byte local_d7;
  byte local_d6;
  byte local_d5;
  byte local_d4;
  byte local_d3;
  byte local_d2;
  byte local_d1;
  byte local_d0;
  byte local_cf;
  byte local_ce;
  byte local_cd;
  byte local_cc;
  byte local_cb;
  byte local_ca;
  byte local_c9;
  byte local_c8;
  byte local_c7;
  byte local_c6;
  byte local_c5;
  byte local_c4;
  byte local_c3;
  byte local_c2;
  byte local_c1;
  undefined1 local_c0 [16];
  undefined1 auStack_b0 [16];
  byte local_a0;
  byte local_9f;
  byte local_9e;
  byte local_9d;
  byte local_9c;
  byte local_9b;
  byte local_9a;
  byte local_99;
  byte local_98;
  byte local_97;
  byte local_96;
  byte local_95;
  byte local_94;
  byte local_93;
  byte local_92;
  byte local_91;
  byte local_90;
  byte local_8f;
  byte local_8e;
  byte local_8d;
  byte local_8c;
  byte local_8b;
  byte local_8a;
  byte local_89;
  byte local_88;
  byte local_87;
  byte local_86;
  byte local_85;
  byte local_84;
  byte local_83;
  byte local_82;
  byte local_81;
  undefined1 local_80 [16];
  undefined1 local_70 [16];
  byte local_50;
  byte local_4f;
  byte local_4e;
  byte local_4d;
  byte local_4c;
  byte local_4b;
  byte local_4a;
  byte local_49;
  byte local_48;
  byte local_47;
  byte local_46;
  byte local_45;
  byte local_44;
  byte local_43;
  byte local_42;
  byte local_41;
  byte local_40;
  byte local_3f;
  byte local_3e;
  byte local_3d;
  byte local_3c;
  byte local_3b;
  byte local_3a;
  byte local_39;
  byte local_38;
  byte local_37;
  byte local_36;
  byte local_35;
  byte local_34;
  byte local_33;
  byte local_32;
  byte local_31;
  
  local_ab0 = 0;
  local_ab4 = 0;
  local_ab8 = 0;
  local_abc = 0;
  local_ac0 = 0;
  local_ac4 = 0;
  local_ad0 = 0;
  local_ad4 = 0;
  local_ad8 = 0;
  local_adc = 0;
  local_ae0 = 0;
  local_ae8 = 0;
  local_af0 = (__m256i *)0x0;
  local_af8 = (int8_t *)0x0;
  local_b00 = (__m256i *)0x0;
  local_b08 = (__m256i *)0x0;
  local_b10 = (__m256i *)0x0;
  local_b61 = 0;
  local_b62 = 0;
  local_ba1 = 0;
  local_c88 = (parasail_result_t *)0x0;
  if (in_RDI == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_rowcol_scan_profile_avx2_256_8","profile");
    local_a90 = (parasail_result_t *)0x0;
  }
  else if (*(long *)(in_RDI + 0x18) == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_rowcol_scan_profile_avx2_256_8",
            "profile->profile8.score");
    local_a90 = (parasail_result_t *)0x0;
  }
  else if (*(long *)(in_RDI + 0x10) == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_rowcol_scan_profile_avx2_256_8",
            "profile->matrix");
    local_a90 = (parasail_result_t *)0x0;
  }
  else if (*(int *)(in_RDI + 8) < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_rowcol_scan_profile_avx2_256_8",
            "profile->s1Len");
    local_a90 = (parasail_result_t *)0x0;
  }
  else if (in_RSI == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_rowcol_scan_profile_avx2_256_8","s2");
    local_a90 = (parasail_result_t *)0x0;
  }
  else if (in_EDX < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_rowcol_scan_profile_avx2_256_8","s2Len");
    local_a90 = (parasail_result_t *)0x0;
  }
  else if ((int)in_ECX < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_rowcol_scan_profile_avx2_256_8","open");
    local_a90 = (parasail_result_t *)0x0;
  }
  else if ((int)in_R8D < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_rowcol_scan_profile_avx2_256_8","gap");
    local_a90 = (parasail_result_t *)0x0;
  }
  else {
    local_ab0 = 0;
    local_ab4 = 0;
    local_ab8 = 0;
    local_abc = *(int *)(in_RDI + 8);
    local_ac0 = local_abc + -1;
    local_ac4 = in_EDX + -1;
    local_ad0 = *(long *)(in_RDI + 0x10);
    local_ad4 = 0x20;
    local_ad8 = (local_abc + 0x1f) / 0x20;
    local_adc = (local_abc + -1) % local_ad8;
    local_ae0 = ~((local_abc + -1) / local_ad8) + 0x20;
    local_ae8 = *(long *)(in_RDI + 0x18);
    local_aa8._0_1_ = (byte)in_ECX;
    local_a81 = (byte)local_aa8;
    local_1c1 = (byte)local_aa8;
    local_1c2 = (byte)local_aa8;
    local_1c3 = (byte)local_aa8;
    local_1c4 = (byte)local_aa8;
    local_1c5 = (byte)local_aa8;
    local_1c6 = (byte)local_aa8;
    local_1c7 = (byte)local_aa8;
    local_1c8 = (byte)local_aa8;
    local_1c9 = (byte)local_aa8;
    local_1ca = (byte)local_aa8;
    local_1cb = (byte)local_aa8;
    local_1cc = (byte)local_aa8;
    local_1cd = (byte)local_aa8;
    local_1ce = (byte)local_aa8;
    local_1cf = (byte)local_aa8;
    local_1d0 = (byte)local_aa8;
    local_1d1 = (byte)local_aa8;
    local_1d2 = (byte)local_aa8;
    local_1d3 = (byte)local_aa8;
    local_1d4 = (byte)local_aa8;
    local_1d5 = (byte)local_aa8;
    local_1d6 = (byte)local_aa8;
    local_1d7 = (byte)local_aa8;
    local_1d8 = (byte)local_aa8;
    local_1d9 = (byte)local_aa8;
    local_1da = (byte)local_aa8;
    local_1db = (byte)local_aa8;
    local_1dc = (byte)local_aa8;
    local_1dd = (byte)local_aa8;
    local_1de = (byte)local_aa8;
    local_1df = (byte)local_aa8;
    local_1e0 = (byte)local_aa8;
    auVar2 = vpinsrb_avx(ZEXT116((byte)local_aa8),in_ECX & 0xff,1);
    auVar2 = vpinsrb_avx(auVar2,in_ECX & 0xff,2);
    auVar2 = vpinsrb_avx(auVar2,in_ECX & 0xff,3);
    auVar2 = vpinsrb_avx(auVar2,in_ECX & 0xff,4);
    auVar2 = vpinsrb_avx(auVar2,in_ECX & 0xff,5);
    auVar2 = vpinsrb_avx(auVar2,in_ECX & 0xff,6);
    auVar2 = vpinsrb_avx(auVar2,in_ECX & 0xff,7);
    auVar2 = vpinsrb_avx(auVar2,in_ECX & 0xff,8);
    auVar2 = vpinsrb_avx(auVar2,in_ECX & 0xff,9);
    auVar2 = vpinsrb_avx(auVar2,in_ECX & 0xff,10);
    auVar2 = vpinsrb_avx(auVar2,in_ECX & 0xff,0xb);
    auVar2 = vpinsrb_avx(auVar2,in_ECX & 0xff,0xc);
    auVar2 = vpinsrb_avx(auVar2,in_ECX & 0xff,0xd);
    auVar2 = vpinsrb_avx(auVar2,in_ECX & 0xff,0xe);
    local_200 = vpinsrb_avx(auVar2,in_ECX & 0xff,0xf);
    auVar2 = vpinsrb_avx(ZEXT116((byte)local_aa8),in_ECX & 0xff,1);
    auVar2 = vpinsrb_avx(auVar2,in_ECX & 0xff,2);
    auVar2 = vpinsrb_avx(auVar2,in_ECX & 0xff,3);
    auVar2 = vpinsrb_avx(auVar2,in_ECX & 0xff,4);
    auVar2 = vpinsrb_avx(auVar2,in_ECX & 0xff,5);
    auVar2 = vpinsrb_avx(auVar2,in_ECX & 0xff,6);
    auVar2 = vpinsrb_avx(auVar2,in_ECX & 0xff,7);
    auVar2 = vpinsrb_avx(auVar2,in_ECX & 0xff,8);
    auVar2 = vpinsrb_avx(auVar2,in_ECX & 0xff,9);
    auVar2 = vpinsrb_avx(auVar2,in_ECX & 0xff,10);
    auVar2 = vpinsrb_avx(auVar2,in_ECX & 0xff,0xb);
    auVar2 = vpinsrb_avx(auVar2,in_ECX & 0xff,0xc);
    auVar2 = vpinsrb_avx(auVar2,in_ECX & 0xff,0xd);
    auVar2 = vpinsrb_avx(auVar2,in_ECX & 0xff,0xe);
    auStack_1f0 = vpinsrb_avx(auVar2,in_ECX & 0xff,0xf);
    local_b40 = local_200._0_8_;
    uStack_b38 = local_200._8_8_;
    uStack_b30 = auStack_1f0._0_8_;
    uStack_b28 = auStack_1f0._8_8_;
    local_aac._0_1_ = (byte)in_R8D;
    local_a82 = (byte)local_aac;
    local_181 = (byte)local_aac;
    local_182 = (byte)local_aac;
    local_183 = (byte)local_aac;
    local_184 = (byte)local_aac;
    local_185 = (byte)local_aac;
    local_186 = (byte)local_aac;
    local_187 = (byte)local_aac;
    local_188 = (byte)local_aac;
    local_189 = (byte)local_aac;
    local_18a = (byte)local_aac;
    local_18b = (byte)local_aac;
    local_18c = (byte)local_aac;
    local_18d = (byte)local_aac;
    local_18e = (byte)local_aac;
    local_18f = (byte)local_aac;
    local_190 = (byte)local_aac;
    local_191 = (byte)local_aac;
    local_192 = (byte)local_aac;
    local_193 = (byte)local_aac;
    local_194 = (byte)local_aac;
    local_195 = (byte)local_aac;
    local_196 = (byte)local_aac;
    local_197 = (byte)local_aac;
    local_198 = (byte)local_aac;
    local_199 = (byte)local_aac;
    local_19a = (byte)local_aac;
    local_19b = (byte)local_aac;
    local_19c = (byte)local_aac;
    local_19d = (byte)local_aac;
    local_19e = (byte)local_aac;
    local_19f = (byte)local_aac;
    local_1a0 = (byte)local_aac;
    auVar2 = vpinsrb_avx(ZEXT116((byte)local_aac),in_R8D & 0xff,1);
    auVar2 = vpinsrb_avx(auVar2,in_R8D & 0xff,2);
    auVar2 = vpinsrb_avx(auVar2,in_R8D & 0xff,3);
    auVar2 = vpinsrb_avx(auVar2,in_R8D & 0xff,4);
    auVar2 = vpinsrb_avx(auVar2,in_R8D & 0xff,5);
    auVar2 = vpinsrb_avx(auVar2,in_R8D & 0xff,6);
    auVar2 = vpinsrb_avx(auVar2,in_R8D & 0xff,7);
    auVar2 = vpinsrb_avx(auVar2,in_R8D & 0xff,8);
    auVar2 = vpinsrb_avx(auVar2,in_R8D & 0xff,9);
    auVar2 = vpinsrb_avx(auVar2,in_R8D & 0xff,10);
    auVar2 = vpinsrb_avx(auVar2,in_R8D & 0xff,0xb);
    auVar2 = vpinsrb_avx(auVar2,in_R8D & 0xff,0xc);
    auVar2 = vpinsrb_avx(auVar2,in_R8D & 0xff,0xd);
    auVar2 = vpinsrb_avx(auVar2,in_R8D & 0xff,0xe);
    auVar2 = vpinsrb_avx(auVar2,in_R8D & 0xff,0xf);
    auVar3 = vpinsrb_avx(ZEXT116((byte)local_aac),in_R8D & 0xff,1);
    auVar3 = vpinsrb_avx(auVar3,in_R8D & 0xff,2);
    auVar3 = vpinsrb_avx(auVar3,in_R8D & 0xff,3);
    auVar3 = vpinsrb_avx(auVar3,in_R8D & 0xff,4);
    auVar3 = vpinsrb_avx(auVar3,in_R8D & 0xff,5);
    auVar3 = vpinsrb_avx(auVar3,in_R8D & 0xff,6);
    auVar3 = vpinsrb_avx(auVar3,in_R8D & 0xff,7);
    auVar3 = vpinsrb_avx(auVar3,in_R8D & 0xff,8);
    auVar3 = vpinsrb_avx(auVar3,in_R8D & 0xff,9);
    auVar3 = vpinsrb_avx(auVar3,in_R8D & 0xff,10);
    auVar3 = vpinsrb_avx(auVar3,in_R8D & 0xff,0xb);
    auVar3 = vpinsrb_avx(auVar3,in_R8D & 0xff,0xc);
    auVar3 = vpinsrb_avx(auVar3,in_R8D & 0xff,0xd);
    auVar3 = vpinsrb_avx(auVar3,in_R8D & 0xff,0xe);
    auVar3 = vpinsrb_avx(auVar3,in_R8D & 0xff,0xf);
    local_1c0._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar3;
    local_1c0._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
    if (*(int *)(local_ad0 + 0x20) <= (int)-in_ECX) {
      local_aa8._0_1_ = -(char)*(undefined4 *)(local_ad0 + 0x20);
    }
    local_ba1 = (byte)local_aa8 + 0x81;
    bVar20 = (*(byte *)(local_ad0 + 0x1c) ^ 0x7f) - 1;
    local_a80._8_8_ = SUB328(ZEXT832(0),4);
    local_ba0 = 0;
    uStack_b98 = local_a80._8_8_;
    uStack_b90 = 0;
    uStack_b88 = 0;
    uVar26 = CONCAT13(local_ba1,in_stack_fffffffffffff190);
    auVar2 = vpinsrb_avx(ZEXT116(local_ba1),(uint)local_ba1,1);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ba1,2);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ba1,3);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ba1,4);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ba1,5);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ba1,6);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ba1,7);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ba1,8);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ba1,9);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ba1,10);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ba1,0xb);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ba1,0xc);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ba1,0xd);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ba1,0xe);
    local_180 = vpinsrb_avx(auVar2,(uint)local_ba1,0xf);
    auVar2 = vpinsrb_avx(ZEXT116(local_ba1),(uint)local_ba1,1);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ba1,2);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ba1,3);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ba1,4);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ba1,5);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ba1,6);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ba1,7);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ba1,8);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ba1,9);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ba1,10);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ba1,0xb);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ba1,0xc);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ba1,0xd);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ba1,0xe);
    auStack_170 = vpinsrb_avx(auVar2,(uint)local_ba1,0xf);
    local_be0 = local_180._0_8_;
    uStack_bd8 = local_180._8_8_;
    uStack_bd0 = auStack_170._0_8_;
    uStack_bc8 = auStack_170._8_8_;
    auVar2 = vpinsrb_avx(ZEXT116(bVar20),(uint)bVar20,1);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar20,2);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar20,3);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar20,4);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar20,5);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar20,6);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar20,7);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar20,8);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar20,9);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar20,10);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar20,0xb);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar20,0xc);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar20,0xd);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar20,0xe);
    local_140 = vpinsrb_avx(auVar2,(uint)bVar20,0xf);
    auVar2 = vpinsrb_avx(ZEXT116(bVar20),(uint)bVar20,1);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar20,2);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar20,3);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar20,4);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar20,5);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar20,6);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar20,7);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar20,8);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar20,9);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar20,10);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar20,0xb);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar20,0xc);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar20,0xd);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar20,0xe);
    auStack_130 = vpinsrb_avx(auVar2,(uint)bVar20,0xf);
    local_c00 = local_140._0_8_;
    uStack_bf8 = local_140._8_8_;
    uStack_bf0 = auStack_130._0_8_;
    uStack_be8 = auStack_130._8_8_;
    local_c20._16_8_ = auStack_130._0_8_;
    local_c20._0_16_ = local_140;
    local_c20._24_8_ = auStack_130._8_8_;
    local_c40._16_8_ = auStack_170._0_8_;
    local_c40._0_16_ = local_180;
    local_c40._24_8_ = auStack_170._8_8_;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_a80._8_8_;
    local_c60._0_16_ = auVar2 << 0x40;
    auVar2 = local_c60._0_16_;
    local_c60 = ZEXT832((ulong)local_a80._8_8_) << 0x40;
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ba1,0);
    local_c60 = vblendps_avx(local_c60,ZEXT1632(auVar2),0xf);
    cVar8 = (char)local_ad8;
    bVar21 = -cVar8 * (byte)local_aac;
    auVar2 = vpinsrb_avx(ZEXT116(bVar21),(uint)bVar21,1);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar21,2);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar21,3);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar21,4);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar21,5);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar21,6);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar21,7);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar21,8);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar21,9);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar21,10);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar21,0xb);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar21,0xc);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar21,0xd);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar21,0xe);
    local_100 = vpinsrb_avx(auVar2,(uint)bVar21,0xf);
    auVar2 = vpinsrb_avx(ZEXT116(bVar21),(uint)bVar21,1);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar21,2);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar21,3);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar21,4);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar21,5);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar21,6);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar21,7);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar21,8);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar21,9);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar21,10);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar21,0xb);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar21,0xc);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar21,0xd);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar21,0xe);
    auStack_f0 = vpinsrb_avx(auVar2,(uint)bVar21,0xf);
    auVar7._16_16_ = auStack_f0;
    auVar7._0_16_ = local_100;
    bVar22 = -cVar8 * (byte)local_aac;
    auVar2 = vpinsrb_avx(ZEXT116(bVar22),(uint)bVar22,1);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar22,2);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar22,3);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar22,4);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar22,5);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar22,6);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar22,7);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar22,8);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar22,9);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar22,10);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar22,0xb);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar22,0xc);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar22,0xd);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar22,0xe);
    local_c0 = vpinsrb_avx(auVar2,(uint)bVar22,0xf);
    auVar2 = vpinsrb_avx(ZEXT116(bVar22),(uint)bVar22,1);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar22,2);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar22,3);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar22,4);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar22,5);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar22,6);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar22,7);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar22,8);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar22,9);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar22,10);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar22,0xb);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar22,0xc);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar22,0xd);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar22,0xe);
    auStack_b0 = vpinsrb_avx(auVar2,(uint)bVar22,0xf);
    auVar6._16_16_ = auStack_b0;
    auVar6._0_16_ = local_c0;
    bVar23 = -cVar8 * (byte)local_aac;
    auVar2 = vpinsrb_avx(ZEXT116(bVar23),(uint)bVar23,1);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar23,2);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar23,3);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar23,4);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar23,5);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar23,6);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar23,7);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar23,8);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar23,9);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar23,10);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar23,0xb);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar23,0xc);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar23,0xd);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar23,0xe);
    local_80 = vpinsrb_avx(auVar2,(uint)bVar23,0xf);
    auVar2 = vpinsrb_avx(ZEXT116(bVar23),(uint)bVar23,1);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar23,2);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar23,3);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar23,4);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar23,5);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar23,6);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar23,7);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar23,8);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar23,9);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar23,10);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar23,0xb);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar23,0xc);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar23,0xd);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar23,0xe);
    local_70 = vpinsrb_avx(auVar2,(uint)bVar23,0xf);
    auVar6 = vperm2i128_avx2(ZEXT1632(local_80),auVar6,0x28);
    local_920 = vpalignr_avx2(auVar7,auVar6,0xf);
    local_900 = local_c60._0_8_;
    uStack_8f8 = local_c60._8_8_;
    uStack_8f0 = local_c60._16_8_;
    uStack_8e8 = local_c60._24_8_;
    local_c80 = vpaddsb_avx2(local_c60,local_920);
    local_b62 = bVar20;
    local_b61 = local_ba1;
    local_aac = in_R8D;
    local_aa8 = in_ECX;
    local_aa4 = in_EDX;
    local_aa0 = in_RSI;
    local_a87 = bVar23;
    local_a86 = bVar22;
    local_a85 = bVar21;
    local_a84 = bVar20;
    local_a83 = local_ba1;
    local_a80 = ZEXT832(0) << 0x20;
    local_160 = local_ba1;
    local_15f = local_ba1;
    local_15e = local_ba1;
    local_15d = local_ba1;
    local_15c = local_ba1;
    local_15b = local_ba1;
    local_15a = local_ba1;
    local_159 = local_ba1;
    local_158 = local_ba1;
    local_157 = local_ba1;
    local_156 = local_ba1;
    local_155 = local_ba1;
    local_154 = local_ba1;
    local_153 = local_ba1;
    local_152 = local_ba1;
    local_151 = local_ba1;
    local_150 = local_ba1;
    local_14f = local_ba1;
    local_14e = local_ba1;
    local_14d = local_ba1;
    local_14c = local_ba1;
    local_14b = local_ba1;
    local_14a = local_ba1;
    local_149 = local_ba1;
    local_148 = local_ba1;
    local_147 = local_ba1;
    local_146 = local_ba1;
    local_145 = local_ba1;
    local_144 = local_ba1;
    local_143 = local_ba1;
    local_142 = local_ba1;
    local_141 = local_ba1;
    local_120 = bVar20;
    local_11f = bVar20;
    local_11e = bVar20;
    local_11d = bVar20;
    local_11c = bVar20;
    local_11b = bVar20;
    local_11a = bVar20;
    local_119 = bVar20;
    local_118 = bVar20;
    local_117 = bVar20;
    local_116 = bVar20;
    local_115 = bVar20;
    local_114 = bVar20;
    local_113 = bVar20;
    local_112 = bVar20;
    local_111 = bVar20;
    local_110 = bVar20;
    local_10f = bVar20;
    local_10e = bVar20;
    local_10d = bVar20;
    local_10c = bVar20;
    local_10b = bVar20;
    local_10a = bVar20;
    local_109 = bVar20;
    local_108 = bVar20;
    local_107 = bVar20;
    local_106 = bVar20;
    local_105 = bVar20;
    local_104 = bVar20;
    local_103 = bVar20;
    local_102 = bVar20;
    local_101 = bVar20;
    local_e0 = bVar21;
    local_df = bVar21;
    local_de = bVar21;
    local_dd = bVar21;
    local_dc = bVar21;
    local_db = bVar21;
    local_da = bVar21;
    local_d9 = bVar21;
    local_d8 = bVar21;
    local_d7 = bVar21;
    local_d6 = bVar21;
    local_d5 = bVar21;
    local_d4 = bVar21;
    local_d3 = bVar21;
    local_d2 = bVar21;
    local_d1 = bVar21;
    local_d0 = bVar21;
    local_cf = bVar21;
    local_ce = bVar21;
    local_cd = bVar21;
    local_cc = bVar21;
    local_cb = bVar21;
    local_ca = bVar21;
    local_c9 = bVar21;
    local_c8 = bVar21;
    local_c7 = bVar21;
    local_c6 = bVar21;
    local_c5 = bVar21;
    local_c4 = bVar21;
    local_c3 = bVar21;
    local_c2 = bVar21;
    local_c1 = bVar21;
    local_a0 = bVar22;
    local_9f = bVar22;
    local_9e = bVar22;
    local_9d = bVar22;
    local_9c = bVar22;
    local_9b = bVar22;
    local_9a = bVar22;
    local_99 = bVar22;
    local_98 = bVar22;
    local_97 = bVar22;
    local_96 = bVar22;
    local_95 = bVar22;
    local_94 = bVar22;
    local_93 = bVar22;
    local_92 = bVar22;
    local_91 = bVar22;
    local_90 = bVar22;
    local_8f = bVar22;
    local_8e = bVar22;
    local_8d = bVar22;
    local_8c = bVar22;
    local_8b = bVar22;
    local_8a = bVar22;
    local_89 = bVar22;
    local_88 = bVar22;
    local_87 = bVar22;
    local_86 = bVar22;
    local_85 = bVar22;
    local_84 = bVar22;
    local_83 = bVar22;
    local_82 = bVar22;
    local_81 = bVar22;
    local_50 = bVar23;
    local_4f = bVar23;
    local_4e = bVar23;
    local_4d = bVar23;
    local_4c = bVar23;
    local_4b = bVar23;
    local_4a = bVar23;
    local_49 = bVar23;
    local_48 = bVar23;
    local_47 = bVar23;
    local_46 = bVar23;
    local_45 = bVar23;
    local_44 = bVar23;
    local_43 = bVar23;
    local_42 = bVar23;
    local_41 = bVar23;
    local_40 = bVar23;
    local_3f = bVar23;
    local_3e = bVar23;
    local_3d = bVar23;
    local_3c = bVar23;
    local_3b = bVar23;
    local_3a = bVar23;
    local_39 = bVar23;
    local_38 = bVar23;
    local_37 = bVar23;
    local_36 = bVar23;
    local_35 = bVar23;
    local_34 = bVar23;
    local_33 = bVar23;
    local_32 = bVar23;
    local_31 = bVar23;
    local_b60 = local_1c0._0_16_;
    auStack_b50 = local_1c0._16_16_;
    local_c88 = parasail_result_new_rowcol1(local_ad8 * 0x20,in_EDX);
    if (local_c88 == (parasail_result_t *)0x0) {
      local_a90 = (parasail_result_t *)0x0;
    }
    else {
      local_c88->flag = local_c88->flag | 0x20100401;
      local_c88->flag = local_c88->flag | 0x40000;
      local_af0 = parasail_memalign___m256i(0x20,(long)local_ad8);
      local_af8 = parasail_memalign_int8_t(0x20,(long)(local_aa4 + 1));
      local_b00 = parasail_memalign___m256i(0x20,(long)local_ad8);
      local_b08 = parasail_memalign___m256i(0x20,(long)local_ad8);
      local_b10 = parasail_memalign___m256i(0x20,(long)local_ad8);
      if (local_af0 == (__m256i *)0x0) {
        local_a90 = (parasail_result_t *)0x0;
      }
      else if (local_af8 == (int8_t *)0x0) {
        local_a90 = (parasail_result_t *)0x0;
      }
      else if (local_b00 == (__m256i *)0x0) {
        local_a90 = (parasail_result_t *)0x0;
      }
      else if (local_b08 == (__m256i *)0x0) {
        local_a90 = (parasail_result_t *)0x0;
      }
      else if (local_b10 == (__m256i *)0x0) {
        local_a90 = (parasail_result_t *)0x0;
      }
      else {
        local_c8c = 0;
        local_ab0 = 0;
        while( true ) {
          if (local_ad8 <= local_ab0) break;
          for (local_c90 = 0; local_c90 < local_ad4; local_c90 = local_c90 + 1) {
            in_stack_fffffffffffff180 =
                 (long)(int)(-(local_aac * (local_c90 * local_ad8 + local_ab0)) - local_aa8);
            in_stack_fffffffffffff188 = in_stack_fffffffffffff180;
            if (in_stack_fffffffffffff180 < -0x80) {
              in_stack_fffffffffffff188 = -0x80;
            }
            *(char *)((long)&local_cc0 + (long)local_c90) = (char)in_stack_fffffffffffff188;
            in_stack_fffffffffffff180 = in_stack_fffffffffffff180 - (int)local_aa8;
            if (in_stack_fffffffffffff180 < -0x80) {
              in_stack_fffffffffffff180 = -0x80;
            }
            *(char *)((long)&local_ce0 + (long)local_c90) = (char)in_stack_fffffffffffff180;
          }
          local_768 = local_b08 + local_c8c;
          (*local_768)[0] = local_cc0;
          (*local_768)[1] = lStack_cb8;
          (*local_768)[2] = lStack_cb0;
          (*local_768)[3] = lStack_ca8;
          local_7a8 = local_af0 + local_c8c;
          (*local_7a8)[0] = local_ce0;
          (*local_7a8)[1] = lStack_cd8;
          (*local_7a8)[2] = lStack_cd0;
          (*local_7a8)[3] = lStack_cc8;
          local_c8c = local_c8c + 1;
          local_ab0 = local_ab0 + 1;
        }
        *local_af8 = '\0';
        for (local_ab0 = 1; local_ab0 <= local_aa4; local_ab0 = local_ab0 + 1) {
          in_stack_fffffffffffff178 = (long)(int)(-(local_aac * (local_ab0 + -1)) - local_aa8);
          if (in_stack_fffffffffffff178 < -0x80) {
            in_stack_fffffffffffff178 = -0x80;
          }
          local_af8[local_ab0] = (int8_t)in_stack_fffffffffffff178;
        }
        local_5c0 = local_ba0;
        uStack_5b8 = uStack_b98;
        uStack_5b0 = uStack_b90;
        uStack_5a8 = uStack_b88;
        local_5e0 = local_b40;
        uStack_5d8 = uStack_b38;
        uStack_5d0 = uStack_b30;
        uStack_5c8 = uStack_b28;
        auVar14._8_8_ = uStack_b98;
        auVar14._0_8_ = local_ba0;
        auVar14._16_8_ = uStack_b90;
        auVar14._24_8_ = uStack_b88;
        auVar5._8_8_ = uStack_b38;
        auVar5._0_8_ = local_b40;
        auVar5._16_8_ = uStack_b30;
        auVar5._24_8_ = uStack_b28;
        local_d20 = vpsubsb_avx2(auVar14,auVar5);
        local_ab0 = local_ad8;
        while (local_ab0 = local_ab0 + -1, -1 < local_ab0) {
          local_7e8 = local_b10 + local_ab0;
          local_820 = local_d20._0_8_;
          lStack_818 = local_d20._8_8_;
          lStack_810 = local_d20._16_8_;
          lStack_808 = local_d20._24_8_;
          (*local_7e8)[0] = local_d20._0_8_;
          (*local_7e8)[1] = local_d20._8_8_;
          (*local_7e8)[2] = local_d20._16_8_;
          (*local_7e8)[3] = local_d20._24_8_;
          local_600 = local_d20._0_8_;
          lStack_5f8 = local_d20._8_8_;
          lStack_5f0 = local_d20._16_8_;
          lStack_5e8 = local_d20._24_8_;
          uStack_610 = auStack_b50._0_8_;
          uStack_608 = auStack_b50._8_8_;
          auVar5._16_8_ = auStack_b50._0_8_;
          auVar5._0_16_ = local_b60;
          auVar5._24_8_ = auStack_b50._8_8_;
          local_d20 = vpsubsb_avx2(local_d20,auVar5);
          local_620 = local_b60;
        }
        for (local_ab4 = 0; auVar25 = ZEXT3264(auVar5), local_ab4 < local_aa4;
            local_ab4 = local_ab4 + 1) {
          local_568 = local_b08 + (local_ad8 + -1);
          auVar6 = vperm2i128_avx2(auVar5,(undefined1  [32])*local_568,0x28);
          auVar6 = vpalignr_avx2((undefined1  [32])*local_568,auVar6,0xf);
          auVar2 = vpinsrb_avx(auVar6._0_16_,(uint)(byte)local_af8[local_ab4],0);
          local_dc0 = (__m256i)vblendps_avx(auVar6,ZEXT1632(auVar2),0xf);
          iVar1 = *(int *)(*(long *)(local_ad0 + 0x10) + (ulong)*(byte *)(local_aa0 + local_ab4) * 4
                          );
          local_640 = local_be0;
          uStack_638 = uStack_bd8;
          uStack_630 = uStack_bd0;
          uStack_628 = uStack_bc8;
          local_660 = (*local_b10)[0];
          lStack_658 = (*local_b10)[1];
          lStack_650 = (*local_b10)[2];
          lStack_648 = (*local_b10)[3];
          alVar4 = *local_b10;
          auVar13._8_8_ = uStack_bd8;
          auVar13._0_8_ = local_be0;
          auVar13._16_8_ = uStack_bd0;
          auVar13._24_8_ = uStack_bc8;
          local_d60 = vpsubsb_avx2(auVar13,(undefined1  [32])alVar4);
          local_d80._8_8_ = uStack_bd8;
          local_d80._0_8_ = local_be0;
          local_d80._16_8_ = uStack_bd0;
          local_d80._24_8_ = uStack_bc8;
          local_ab0 = 0;
          while( true ) {
            if (local_ad8 <= local_ab0) break;
            local_570 = local_b08 + local_ab0;
            auVar17 = *(undefined1 (*) [24])*local_570;
            lStack_6a8 = (*local_570)[3];
            alVar19 = *local_570;
            local_578 = local_af0 + local_ab0;
            auVar18 = *(undefined1 (*) [24])*local_578;
            lStack_668 = (*local_578)[3];
            local_580 = (undefined1 (*) [32])
                        (local_ae8 + (long)(iVar1 * local_ad8) * 0x20 + (long)local_ab0 * 0x20);
            local_960 = *(undefined8 *)*local_580;
            uStack_958 = *(undefined8 *)(*local_580 + 8);
            uStack_950 = *(undefined8 *)(*local_580 + 0x10);
            uStack_948 = *(undefined8 *)(*local_580 + 0x18);
            local_d40 = auVar18._0_8_;
            local_680 = local_d40;
            lStack_d38 = auVar18._8_8_;
            uStack_678 = lStack_d38;
            lStack_d30 = auVar18._16_8_;
            uStack_670 = lStack_d30;
            uStack_690 = auStack_b50._0_8_;
            uStack_688 = auStack_b50._8_8_;
            auVar12._16_8_ = auStack_b50._0_8_;
            auVar12._0_16_ = local_b60;
            auVar12._24_8_ = auStack_b50._8_8_;
            local_340 = vpsubsb_avx2((undefined1  [32])*local_578,auVar12);
            local_da0._0_8_ = auVar17._0_8_;
            local_6c0 = local_da0._0_8_;
            local_da0._8_8_ = auVar17._8_8_;
            uStack_6b8 = local_da0._8_8_;
            local_da0._16_8_ = auVar17._16_8_;
            uStack_6b0 = local_da0._16_8_;
            local_6e0 = local_b40;
            uStack_6d8 = uStack_b38;
            uStack_6d0 = uStack_b30;
            uStack_6c8 = uStack_b28;
            auVar11._8_8_ = uStack_b38;
            auVar11._0_8_ = local_b40;
            auVar11._16_8_ = uStack_b30;
            auVar11._24_8_ = uStack_b28;
            local_360 = vpsubsb_avx2((undefined1  [32])*local_570,auVar11);
            auVar6 = vpmaxsb_avx2(local_340,local_360);
            local_940 = local_dc0[0];
            lStack_938 = local_dc0[1];
            lStack_930 = local_dc0[2];
            lStack_928 = local_dc0[3];
            alVar4 = (__m256i)vpaddsb_avx2((undefined1  [32])local_dc0,*local_580);
            local_380 = local_d80._0_8_;
            uStack_378 = local_d80._8_8_;
            uStack_370 = local_d80._16_8_;
            uStack_368 = local_d80._24_8_;
            local_980 = local_d60._0_8_;
            uStack_978 = local_d60._8_8_;
            uStack_970 = local_d60._16_8_;
            uStack_968 = local_d60._24_8_;
            palVar24 = local_b10 + local_ab0;
            local_9a0 = (*palVar24)[0];
            lStack_998 = (*palVar24)[1];
            lStack_990 = (*palVar24)[2];
            lStack_988 = (*palVar24)[3];
            local_3a0 = vpaddsb_avx2(local_d60,(undefined1  [32])*palVar24);
            local_d80 = vpmaxsb_avx2(local_d80,local_3a0);
            local_d40 = auVar6._0_8_;
            local_3c0 = local_d40;
            lStack_d38 = auVar6._8_8_;
            lStack_3b8 = lStack_d38;
            lStack_d30 = auVar6._16_8_;
            lStack_3b0 = lStack_d30;
            lStack_d28 = auVar6._24_8_;
            lStack_3a8 = lStack_d28;
            local_dc0[0] = alVar4[0];
            local_3e0 = local_dc0[0];
            local_dc0[1] = alVar4[1];
            lStack_3d8 = local_dc0[1];
            local_dc0[2] = alVar4[2];
            lStack_3d0 = local_dc0[2];
            local_dc0[3] = alVar4[3];
            lStack_3c8 = local_dc0[3];
            local_d60 = vpmaxsb_avx2(auVar6,(undefined1  [32])alVar4);
            local_828 = local_af0 + local_ab0;
            local_860 = local_d40;
            lStack_858 = lStack_d38;
            lStack_850 = lStack_d30;
            lStack_848 = lStack_d28;
            (*local_828)[0] = local_d40;
            (*local_828)[1] = lStack_d38;
            (*local_828)[2] = lStack_d30;
            (*local_828)[3] = lStack_d28;
            local_868 = local_b00 + local_ab0;
            local_8a0 = local_d60._0_8_;
            lStack_898 = local_d60._8_8_;
            lStack_890 = local_d60._16_8_;
            lStack_888 = local_d60._24_8_;
            (*local_868)[0] = local_d60._0_8_;
            (*local_868)[1] = local_d60._8_8_;
            (*local_868)[2] = local_d60._16_8_;
            (*local_868)[3] = local_d60._24_8_;
            local_ab0 = local_ab0 + 1;
            local_dc0 = alVar19;
            local_6a0 = local_b60;
          }
          auVar6 = vperm2i128_avx2((undefined1  [32])alVar4,local_d60,0x28);
          auVar6 = vpalignr_avx2(local_d60,auVar6,0xf);
          auVar2 = vpinsrb_avx(auVar6._0_16_,(uint)(byte)local_af8[(long)local_ab4 + 1],0);
          auVar6 = vblendps_avx(auVar6,ZEXT1632(auVar2),0xf);
          local_400 = local_d80._0_8_;
          uStack_3f8 = local_d80._8_8_;
          uStack_3f0 = local_d80._16_8_;
          uStack_3e8 = local_d80._24_8_;
          local_d60._0_8_ = auVar6._0_8_;
          local_9c0 = local_d60._0_8_;
          local_d60._8_8_ = auVar6._8_8_;
          uStack_9b8 = local_d60._8_8_;
          local_d60._16_8_ = auVar6._16_8_;
          uStack_9b0 = local_d60._16_8_;
          local_d60._24_8_ = auVar6._24_8_;
          uStack_9a8 = local_d60._24_8_;
          local_9e0 = (*local_b10)[0];
          lStack_9d8 = (*local_b10)[1];
          lStack_9d0 = (*local_b10)[2];
          lStack_9c8 = (*local_b10)[3];
          local_420 = vpaddsb_avx2(auVar6,(undefined1  [32])*local_b10);
          local_d80 = vpmaxsb_avx2(local_d80,local_420);
          auVar7 = local_420;
          for (local_ab0 = 0; local_ab0 < local_ad4 + -2; local_ab0 = local_ab0 + 1) {
            auVar7 = vperm2i128_avx2(auVar7,local_d80,0x28);
            auVar7 = vpalignr_avx2(local_d80,auVar7,0xf);
            local_e20 = auVar7._0_8_;
            local_a00 = local_e20;
            uStack_e18 = auVar7._8_8_;
            uStack_9f8 = uStack_e18;
            uStack_e10 = auVar7._16_8_;
            uStack_9f0 = uStack_e10;
            uStack_e08 = auVar7._24_8_;
            uStack_9e8 = uStack_e08;
            local_a20 = local_c80._0_8_;
            uStack_a18 = local_c80._8_8_;
            uStack_a10 = local_c80._16_8_;
            uStack_a08 = local_c80._24_8_;
            auVar7 = vpaddsb_avx2(auVar7,local_c80);
            local_440 = local_d80._0_8_;
            uStack_438 = local_d80._8_8_;
            uStack_430 = local_d80._16_8_;
            uStack_428 = local_d80._24_8_;
            local_e20 = auVar7._0_8_;
            local_460 = local_e20;
            uStack_e18 = auVar7._8_8_;
            uStack_458 = uStack_e18;
            uStack_e10 = auVar7._16_8_;
            uStack_450 = uStack_e10;
            uStack_e08 = auVar7._24_8_;
            uStack_448 = uStack_e08;
            local_d80 = vpmaxsb_avx2(local_d80,auVar7);
          }
          auVar7 = vperm2i128_avx2(auVar7,local_d80,0x28);
          auVar7 = vpalignr_avx2(local_d80,auVar7,0xf);
          local_d80._0_8_ = auVar7._0_8_;
          local_a40 = local_d80._0_8_;
          local_d80._8_8_ = auVar7._8_8_;
          uStack_a38 = local_d80._8_8_;
          local_d80._16_8_ = auVar7._16_8_;
          uStack_a30 = local_d80._16_8_;
          local_d80._24_8_ = auVar7._24_8_;
          uStack_a28 = local_d80._24_8_;
          local_a60 = local_c60._0_8_;
          uStack_a58 = local_c60._8_8_;
          uStack_a50 = local_c60._16_8_;
          uStack_a48 = local_c60._24_8_;
          auVar5 = vpaddsb_avx2(auVar7,local_c60);
          local_480 = local_d60._0_8_;
          uStack_478 = local_d60._8_8_;
          uStack_470 = local_d60._16_8_;
          uStack_468 = local_d60._24_8_;
          local_d80._0_8_ = auVar5._0_8_;
          local_4a0 = local_d80._0_8_;
          local_d80._8_8_ = auVar5._8_8_;
          uStack_498 = local_d80._8_8_;
          local_d80._16_8_ = auVar5._16_8_;
          uStack_490 = local_d80._16_8_;
          local_d80._24_8_ = auVar5._24_8_;
          uStack_488 = local_d80._24_8_;
          _local_da0 = (__m256i)vpmaxsb_avx2(auVar6,auVar5);
          local_d80 = auVar5;
          for (local_ab0 = 0; local_ab0 < local_ad8; local_ab0 = local_ab0 + 1) {
            local_588 = local_b00 + local_ab0;
            auVar17 = *(undefined1 (*) [24])*local_588;
            lStack_4e8 = (*local_588)[3];
            local_700 = local_d80._0_8_;
            uStack_6f8 = local_d80._8_8_;
            uStack_6f0 = local_d80._16_8_;
            uStack_6e8 = local_d80._24_8_;
            uStack_710 = auStack_b50._0_8_;
            uStack_708 = auStack_b50._8_8_;
            auVar10._16_8_ = auStack_b50._0_8_;
            auVar10._0_16_ = local_b60;
            auVar10._24_8_ = auStack_b50._8_8_;
            local_4c0 = vpsubsb_avx2(local_d80,auVar10);
            local_740 = local_da0._0_8_;
            uStack_738 = local_da0._8_8_;
            uStack_730 = local_da0._16_8_;
            uStack_728 = lStack_d88;
            local_760 = local_b40;
            uStack_758 = uStack_b38;
            uStack_750 = uStack_b30;
            uStack_748 = uStack_b28;
            auVar9._8_8_ = uStack_b38;
            auVar9._0_8_ = local_b40;
            auVar9._16_8_ = uStack_b30;
            auVar9._24_8_ = uStack_b28;
            local_4e0 = vpsubsb_avx2((undefined1  [32])_local_da0,auVar9);
            local_d80 = vpmaxsb_avx2(local_4c0,local_4e0);
            local_d60._0_8_ = auVar17._0_8_;
            local_500 = local_d60._0_8_;
            local_d60._8_8_ = auVar17._8_8_;
            uStack_4f8 = local_d60._8_8_;
            local_d60._16_8_ = auVar17._16_8_;
            uStack_4f0 = local_d60._16_8_;
            local_520 = local_d80._0_8_;
            uStack_518 = local_d80._8_8_;
            uStack_510 = local_d80._16_8_;
            uStack_508 = local_d80._24_8_;
            auVar5 = vpmaxsb_avx2((undefined1  [32])*local_588,local_d80);
            local_8a8 = local_b08 + local_ab0;
            local_da0._0_8_ = auVar5._0_8_;
            local_8e0 = local_da0._0_8_;
            local_da0._8_8_ = auVar5._8_8_;
            lStack_8d8 = local_da0._8_8_;
            local_da0._16_8_ = auVar5._16_8_;
            lStack_8d0 = local_da0._16_8_;
            lStack_d88 = auVar5._24_8_;
            lStack_8c8 = lStack_d88;
            (*local_8a8)[0] = local_da0._0_8_;
            (*local_8a8)[1] = local_da0._8_8_;
            (*local_8a8)[2] = local_da0._16_8_;
            (*local_8a8)[3] = lStack_d88;
            local_300 = local_c20._0_8_;
            uStack_2f8 = local_c20._8_8_;
            uStack_2f0 = local_c20._16_8_;
            uStack_2e8 = local_c20._24_8_;
            local_320 = local_da0._0_8_;
            lStack_318 = local_da0._8_8_;
            lStack_310 = local_da0._16_8_;
            lStack_308 = lStack_d88;
            local_c20 = vpminsb_avx2(local_c20,auVar5);
            local_540 = local_c40._0_8_;
            uStack_538 = local_c40._8_8_;
            uStack_530 = local_c40._16_8_;
            uStack_528 = local_c40._24_8_;
            local_560 = local_da0._0_8_;
            lStack_558 = local_da0._8_8_;
            lStack_550 = local_da0._16_8_;
            lStack_548 = lStack_d88;
            local_c40 = vpmaxsb_avx2(local_c40,auVar5);
            _local_da0 = (__m256i)auVar5;
            local_720 = local_b60;
          }
          local_590 = local_b08 + local_adc;
          _local_da0 = *local_590;
          for (local_ab8 = 0; local_ab8 < local_ae0; local_ab8 = local_ab8 + 1) {
            auVar5 = vperm2i128_avx2(auVar5,(undefined1  [32])_local_da0,0x28);
            _local_da0 = (__m256i)vpalignr_avx2((undefined1  [32])_local_da0,auVar5,0xf);
          }
          ((local_c88->field_4).rowcols)->score_row[local_ab4] = (int)local_da0[0x17];
        }
        for (local_ab0 = 0; local_ab0 < local_ad8; local_ab0 = local_ab0 + 1) {
          local_598 = local_b08 + local_ab0;
          alVar4[1] = in_stack_fffffffffffff180;
          alVar4[0] = in_stack_fffffffffffff178;
          alVar4[2] = in_stack_fffffffffffff188;
          alVar4[3]._0_4_ = uVar26;
          alVar4[3]._4_1_ = bVar20;
          alVar4[3]._5_1_ = bVar21;
          alVar4[3]._6_1_ = bVar22;
          alVar4[3]._7_1_ = bVar23;
          arr_store_col(in_stack_fffffffffffff1a0,alVar4,in_stack_fffffffffffff174,
                        in_stack_fffffffffffff170);
        }
        local_5a0 = local_b08 + local_adc;
        local_e60 = *local_5a0;
        for (local_ab8 = 0; local_ab8 < local_ae0; local_ab8 = local_ab8 + 1) {
          auVar6 = vperm2i128_avx2(auVar25._0_32_,(undefined1  [32])local_e60,0x28);
          auVar25 = ZEXT3264(auVar6);
          local_e60 = (__m256i)vpalignr_avx2((undefined1  [32])local_e60,auVar6,0xf);
        }
        local_ba1 = cStack_e41;
        local_220 = local_be0;
        uStack_218 = uStack_bd8;
        uStack_210 = uStack_bd0;
        uStack_208 = uStack_bc8;
        local_240 = local_c20._0_8_;
        uStack_238 = local_c20._8_8_;
        uStack_230 = local_c20._16_8_;
        uStack_228 = local_c20._24_8_;
        auVar16._8_8_ = uStack_bd8;
        auVar16._0_8_ = local_be0;
        auVar16._16_8_ = uStack_bd0;
        auVar16._24_8_ = uStack_bc8;
        local_2a0 = vpcmpgtb_avx2(auVar16,local_c20);
        local_260 = local_c40._0_8_;
        uStack_258 = local_c40._8_8_;
        uStack_250 = local_c40._16_8_;
        uStack_248 = local_c40._24_8_;
        local_280 = local_c00;
        uStack_278 = uStack_bf8;
        uStack_270 = uStack_bf0;
        uStack_268 = uStack_be8;
        auVar15._8_8_ = uStack_bf8;
        auVar15._0_8_ = local_c00;
        auVar15._16_8_ = uStack_bf0;
        auVar15._24_8_ = uStack_be8;
        local_2c0 = vpcmpgtb_avx2(local_c40,auVar15);
        local_2e0 = vpor_avx2(local_2a0,local_2c0);
        if ((((((((((((((((((((((((((((((((local_2e0 >> 7 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0 ||
                                         (local_2e0 >> 0xf & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (local_2e0 >> 0x17 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (local_2e0 >> 0x1f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (local_2e0 >> 0x27 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (local_2e0 >> 0x2f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (local_2e0 >> 0x37 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (local_2e0 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (local_2e0 >> 0x47 & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                                 (local_2e0 >> 0x4f & (undefined1  [32])0x1) !=
                                 (undefined1  [32])0x0) ||
                                (local_2e0 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                ) || (local_2e0 >> 0x5f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                              (local_2e0 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || (local_2e0 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                             ) || (local_2e0 >> 0x77 & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) || SUB321(local_2e0 >> 0x7f,0) != '\0') ||
                          (local_2e0 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_2e0 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (local_2e0 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (local_2e0 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_2e0 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (local_2e0 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (local_2e0 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(local_2e0 >> 0xbf,0) != '\0') ||
                  (local_2e0 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (local_2e0 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_2e0 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (local_2e0 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (local_2e0 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             (local_2e0 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_2e0 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            local_2e0[0x1f] < '\0') {
          local_c88->flag = local_c88->flag | 0x40;
          local_ba1 = '\0';
          local_ac0 = 0;
          local_ac4 = 0;
        }
        local_c88->score = (int)(char)local_ba1;
        local_c88->end_query = local_ac0;
        local_c88->end_ref = local_ac4;
        parasail_free(local_b10);
        parasail_free(local_b08);
        parasail_free(local_b00);
        parasail_free(local_af8);
        parasail_free(local_af0);
        local_a90 = local_c88;
      }
    }
  }
  return local_a90;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvE = NULL;
    int8_t* restrict boundary = NULL;
    __m256i* restrict pvHt = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int8_t NEG_LIMIT = 0;
    int8_t POS_LIMIT = 0;
    __m256i vZero;
    int8_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile8.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 32; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m256i*)profile->profile8.score;
    vGapO = _mm256_set1_epi8(open);
    vGapE = _mm256_set1_epi8(gap);
    NEG_LIMIT = (-open < matrix->min ? INT8_MIN + open : INT8_MIN - matrix->min) + 1;
    POS_LIMIT = INT8_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi8(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi8(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm256_insert_epi8_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_adds_epi8(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi8(-segLen*gap), 1));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_32;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int8_t(32, s2Len+1);
    pvHt= parasail_memalign___m256i(32, segLen);
    pvH = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_8_t h;
            __m256i_8_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
            }
            _mm256_store_si256(&pvH[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT8_MIN ? INT8_MIN : tmp;
        }
    }

    {
        __m256i vGapper = _mm256_subs_epi8(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            vGapper = _mm256_subs_epi8(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vHt;
        __m256i vF;
        __m256i vH;
        __m256i vHp;
        __m256i *pvW;
        __m256i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 1);
        vHp = _mm256_insert_epi8_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm256_subs_epi8(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vE = _mm256_load_si256(pvE+i);
            vW = _mm256_load_si256(pvW+i);
            vE = _mm256_max_epi8(
                    _mm256_subs_epi8(vE, vGapE),
                    _mm256_subs_epi8(vH, vGapO));
            vHp = _mm256_adds_epi8(vHp, vW);
            vF = _mm256_max_epi8(vF, _mm256_adds_epi8(vHt, pvGapper[i]));
            vHt = _mm256_max_epi8(vE, vHp);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 1);
        vHt = _mm256_insert_epi8_rpl(vHt, boundary[j+1], 0);
        vF = _mm256_max_epi8(vF, _mm256_adds_epi8(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 1);
            vFt = _mm256_adds_epi8(vFt, vSegLenXgap);
            vF = _mm256_max_epi8(vF, vFt);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 1);
        vF = _mm256_adds_epi8(vF, vNegInfFront);
        vH = _mm256_max_epi8(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm256_load_si256(pvHt+i);
            vF = _mm256_max_epi8(
                    _mm256_subs_epi8(vF, vGapE),
                    _mm256_subs_epi8(vH, vGapO));
            vH = _mm256_max_epi8(vHt, vF);
            _mm256_store_si256(pvH+i, vH);
            vSaturationCheckMin = _mm256_min_epi8(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 


#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 1);
            }
            result->rowcols->score_row[j] = (int8_t) _mm256_extract_epi8_rpl (vH, 31);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m256i vH = _mm256_load_si256(pvH + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl(vH, 1);
        }
        score = (int8_t) _mm256_extract_epi8_rpl (vH, 31);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi8_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi8(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}